

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xorfilter.h
# Opt level: O0

void xor_buffered_increment_counter
               (uint32_t index,uint64_t hash,xor_setbuffer_t *buffer,xor_xorset_t *sets)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  xor_keyindex_t ki;
  size_t i;
  size_t offset;
  size_t addr;
  uint32_t slot;
  xor_xorset_t *sets_local;
  xor_setbuffer_t *buffer_local;
  uint64_t hash_local;
  uint32_t index_local;
  
  uVar1 = index >> ((byte)buffer->insignificantbits & 0x1f);
  uVar2 = buffer->counts[uVar1] + (uVar1 << ((byte)buffer->insignificantbits & 0x1f));
  buffer->buffer[uVar2].index = index;
  buffer->buffer[uVar2].hash = hash;
  buffer->counts[uVar1] = buffer->counts[uVar1] + 1;
  uVar3 = (ulong)(uVar1 << ((byte)buffer->insignificantbits & 0x1f));
  i = uVar3;
  if (buffer->counts[uVar1] == buffer->slotsize) {
    for (; i < buffer->slotsize + uVar3; i = i + 1) {
      uVar4 = *(ulong *)&buffer->buffer[i].index;
      sets[uVar4 & 0xffffffff].xormask = buffer->buffer[i].hash ^ sets[uVar4 & 0xffffffff].xormask;
      uVar4 = uVar4 & 0xffffffff;
      sets[uVar4].count = sets[uVar4].count + 1;
    }
    buffer->counts[uVar1] = 0;
  }
  return;
}

Assistant:

static inline void xor_buffered_increment_counter(uint32_t index, uint64_t hash,
                                                  xor_setbuffer_t *buffer,
                                                  xor_xorset_t *sets) {
  uint32_t slot = index >> (uint32_t)buffer->insignificantbits;
  size_t addr = buffer->counts[slot] + (slot << (uint32_t)buffer->insignificantbits);
  buffer->buffer[addr].index = index;
  buffer->buffer[addr].hash = hash;
  buffer->counts[slot]++;
  size_t offset = (slot << (uint32_t)buffer->insignificantbits);
  if (buffer->counts[slot] == buffer->slotsize) {
    // must empty the buffer
    for (size_t i = offset; i < buffer->slotsize + offset; i++) {
      xor_keyindex_t ki =
          buffer->buffer[i];
      sets[ki.index].xormask ^= ki.hash;
      sets[ki.index].count++;
    }
    buffer->counts[slot] = 0;
  }
}